

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O2

void __thiscall cppjieba::SegmentBase::SegmentBase(SegmentBase *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_199;
  Logger local_198;
  
  this->_vptr_SegmentBase = (_func_int **)&PTR__SegmentBase_001982a0;
  (this->symbols_)._M_h._M_buckets = &(this->symbols_)._M_h._M_single_bucket;
  (this->symbols_)._M_h._M_bucket_count = 1;
  (this->symbols_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbols_)._M_h._M_element_count = 0;
  (this->symbols_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbols_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbols_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,anon_var_dwarf_21530,&local_199);
  bVar1 = ResetSeparators(this,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  if (!bVar1) {
    limonp::Logger::Logger
              (&local_198,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/SegmentBase.hpp"
               ,0x12);
    poVar2 = std::operator<<((ostream *)&local_198,"exp: [ResetSeparators(SPECIAL_SEPARATORS)");
    std::operator<<(poVar2,"] false. ");
    limonp::Logger::~Logger(&local_198);
  }
  return;
}

Assistant:

SegmentBase() {
    XCHECK(ResetSeparators(SPECIAL_SEPARATORS));
  }